

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhs1(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *ufb,
              VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *lfb)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  undefined8 uVar4;
  Item *pIVar5;
  int iVar6;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  cpp_dec_float<50U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_f8;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c0;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_78;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_40;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_38;
  
  if ((this->thevectors->set).thenum < 1) {
    return;
  }
  lVar12 = 0;
  local_c0 = lfb;
  local_40 = this;
  local_38 = ufb;
LAB_00261fbb:
  SVar2 = ((this->
           super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thedesc.stat)->data[lVar12];
  if (this->theRep * SVar2 < 1) {
    local_b8.fpclass = cpp_dec_float_finite;
    local_b8.prec_elem = 10;
    local_b8.data._M_elems[0] = 0;
    local_b8.data._M_elems[1] = 0;
    local_b8.data._M_elems[2] = 0;
    local_b8.data._M_elems[3] = 0;
    local_b8.data._M_elems[4] = 0;
    local_b8.data._M_elems[5] = 0;
    local_b8.data._M_elems._24_5_ = 0;
    local_b8.data._M_elems[7]._1_3_ = 0;
    local_b8.data._M_elems._32_5_ = 0;
    local_b8.data._M_elems[9]._1_3_ = 0;
    local_b8.exp = 0;
    local_b8.neg = false;
    pVVar7 = ufb;
    switch(SVar2) {
    case P_FIXED:
    case P_ON_LOWER:
    case D_ON_LOWER:
    case D_ON_BOTH:
      goto switchD_00262012_caseD_fffffffa;
    default:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"ESVECS03 ERROR: ",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
      local_f8.data._M_elems._0_8_ = local_f8.data._M_elems + 4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"XSVECS04 This should never happen.","");
      *puVar9 = &PTR__SPxException_003af870;
      puVar9[1] = puVar9 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar9 + 1),local_f8.data._M_elems._0_8_,
                 local_f8.data._M_elems._0_8_ + local_f8.data._M_elems._8_8_);
      *puVar9 = &PTR__SPxException_003b0638;
      __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
    case P_ON_UPPER:
    case D_ON_UPPER:
      goto switchD_00262012_caseD_fffffffe;
    case P_FREE:
    case D_FREE:
    case D_UNDEFINED:
      break;
    }
  }
switchD_00262012_caseD_ffffffff:
  lVar12 = lVar12 + 1;
  if ((this->thevectors->set).thenum <= lVar12) {
    return;
  }
  goto LAB_00261fbb;
switchD_00262012_caseD_fffffffa:
  pVVar7 = local_c0;
switchD_00262012_caseD_fffffffe:
  pnVar3 = (pVVar7->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = *(undefined8 *)((long)&pnVar3[lVar12].m_backend.data + 0x20);
  local_b8.data._M_elems._32_5_ = SUB85(uVar4,0);
  local_b8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
  local_b8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[lVar12].m_backend.data;
  local_b8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[lVar12].m_backend.data + 8);
  puVar1 = (uint *)((long)&pnVar3[lVar12].m_backend.data + 0x10);
  local_b8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  uVar4 = *(undefined8 *)(puVar1 + 2);
  local_b8.data._M_elems._24_5_ = SUB85(uVar4,0);
  local_b8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
  local_b8.exp = pnVar3[lVar12].m_backend.exp;
  local_b8.neg = pnVar3[lVar12].m_backend.neg;
  local_b8.fpclass = pnVar3[lVar12].m_backend.fpclass;
  local_b8.prec_elem = pnVar3[lVar12].m_backend.prec_elem;
  if (local_b8.fpclass != cpp_dec_float_NaN) {
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems._24_5_ = 0;
    local_f8.data._M_elems[7]._1_3_ = 0;
    local_f8.data._M_elems._32_5_ = 0;
    local_f8.data._M_elems[9]._1_3_ = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_f8,0.0);
    iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&local_b8,&local_f8);
    if (iVar6 == 0) goto switchD_00262012_caseD_ffffffff;
  }
  pVVar7 = this->theFrhs;
  local_78.data._M_elems[7]._1_3_ = local_b8.data._M_elems[7]._1_3_;
  local_78.data._M_elems._24_5_ = local_b8.data._M_elems._24_5_;
  local_78.data._M_elems[0] = local_b8.data._M_elems[0];
  local_78.data._M_elems[1] = local_b8.data._M_elems[1];
  local_78.data._M_elems[2] = local_b8.data._M_elems[2];
  local_78.data._M_elems[3] = local_b8.data._M_elems[3];
  local_78.data._M_elems[9]._1_3_ = local_b8.data._M_elems[9]._1_3_;
  local_78.data._M_elems._32_5_ = local_b8.data._M_elems._32_5_;
  local_78.data._M_elems[4] = local_b8.data._M_elems[4];
  local_78.data._M_elems[5] = local_b8.data._M_elems[5];
  local_78.exp = local_b8.exp;
  local_78.neg = local_b8.neg;
  local_78.fpclass = local_b8.fpclass;
  local_78.prec_elem = local_b8.prec_elem;
  if (local_b8.fpclass != cpp_dec_float_finite || local_b8.data._M_elems[0] != 0) {
    local_78.neg = (bool)(local_b8.neg ^ 1);
  }
  pIVar5 = (this->thevectors->set).theitem;
  iVar6 = (this->thevectors->set).thekey[lVar12].idx;
  lVar10 = (long)pIVar5[iVar6].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
  ufb = local_38;
  this = local_40;
  if (0 < lVar10) {
    pIVar5 = pIVar5 + iVar6;
    lVar11 = lVar10 + 1;
    lVar10 = lVar10 * 0x3c;
    do {
      pcVar8 = (cpp_dec_float<50U,_int,_void> *)
               ((long)&(pIVar5->data).
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .m_elem[-1].val.m_backend.data + lVar10);
      local_f8.fpclass = cpp_dec_float_finite;
      local_f8.prec_elem = 10;
      local_f8.data._M_elems[0] = 0;
      local_f8.data._M_elems[1] = 0;
      local_f8.data._M_elems[2] = 0;
      local_f8.data._M_elems[3] = 0;
      local_f8.data._M_elems[4] = 0;
      local_f8.data._M_elems[5] = 0;
      local_f8.data._M_elems._24_5_ = 0;
      local_f8.data._M_elems[7]._1_3_ = 0;
      local_f8.data._M_elems._32_5_ = 0;
      local_f8.data._M_elems[9]._1_3_ = 0;
      local_f8.exp = 0;
      local_f8.neg = false;
      v = &local_78;
      if (pcVar8 != &local_f8) {
        local_f8.data._M_elems._32_5_ = local_78.data._M_elems._32_5_;
        local_f8.data._M_elems[9]._1_3_ = local_78.data._M_elems[9]._1_3_;
        local_f8.data._M_elems[1] = local_78.data._M_elems[1];
        local_f8.data._M_elems[0] = local_78.data._M_elems[0];
        local_f8.data._M_elems._8_8_ = CONCAT44(local_78.data._M_elems[3],local_78.data._M_elems[2])
        ;
        local_f8.data._M_elems[4] = local_78.data._M_elems[4];
        local_f8.data._M_elems[5] = local_78.data._M_elems[5];
        local_f8.data._M_elems._24_5_ = local_78.data._M_elems._24_5_;
        local_f8.data._M_elems[7]._1_3_ = local_78.data._M_elems[7]._1_3_;
        local_f8.exp = local_78.exp;
        local_f8.neg = local_78.neg;
        local_f8.fpclass = local_78.fpclass;
        local_f8.prec_elem = local_78.prec_elem;
        v = pcVar8;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_f8,v);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                (&(pVVar7->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start
                  [*(int *)((long)(&(pIVar5->data).
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .m_elem[-1].val + 1) + lVar10)].m_backend,&local_f8);
      lVar11 = lVar11 + -1;
      ufb = local_38;
      this = local_40;
      lVar10 = lVar10 + -0x3c;
    } while (1 < lVar11);
  }
  goto switchD_00262012_caseD_ffffffff;
}

Assistant:

void SPxSolverBase<R>::computeFrhs1(
   const VectorBase<R>& ufb,    ///< upper feasibility bound for variables
   const VectorBase<R>& lfb)    ///< lower feasibility bound for variables
{

   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(int i = 0; i < coDim(); ++i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.status(i);

      if(!isBasic(stat))
      {
         R x;

         // coverity[switch_selector_expr_is_constant]
         switch(stat)
         {
         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
         case SPxBasisBase<R>::Desc::P_FREE :
            continue;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
            x = ufb[i];
            break;

         case SPxBasisBase<R>::Desc::P_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
            x = lfb[i];
            break;

         case(SPxBasisBase<R>::Desc::P_FIXED) :
            assert(EQ(lfb[i], ufb[i], this->epsilon()));

         //lint -fallthrough
         case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
            x = lfb[i];
            break;

         default:
            SPX_MSG_ERROR(std::cerr << "ESVECS03 ERROR: "
                          << "inconsistent basis must not happen!"
                          << std::endl;)
            throw SPxInternalCodeException("XSVECS04 This should never happen.");
         }

         assert(x < R(infinity));
         assert(x > R(-infinity));

         if(x != 0.0)
            theFrhs->multAdd(-x, vector(i));
      }
   }
}